

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diagnostics.h
# Opt level: O1

void __thiscall flow::diagnostics::Report::typeError<>(Report *this,SourceLocation *sloc,string *f)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  basic_string_view<char> format_str;
  undefined1 auVar3 [16];
  string local_2b0;
  SourceLocation local_290;
  undefined4 local_258 [6];
  undefined **local_240;
  undefined1 *local_238;
  long lStack_230;
  ulong local_228;
  undefined1 local_220 [504];
  
  paVar1 = &local_290.filename.field_2;
  pcVar2 = (sloc->filename)._M_dataplus._M_p;
  local_290.filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_290,pcVar2,pcVar2 + (sloc->filename)._M_string_length);
  local_290.end.column = (sloc->end).column;
  local_290.end.offset = (sloc->end).offset;
  local_290.begin.line = (sloc->begin).line;
  local_290.begin.column = (sloc->begin).column;
  local_290._40_8_ = *(undefined8 *)&(sloc->begin).offset;
  format_str.data_ = (f->_M_dataplus)._M_p;
  format_str.size_ = f->_M_string_length;
  local_258[0] = 0;
  lStack_230 = 0;
  local_240 = &PTR_grow_001aeda8;
  local_228 = 500;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_258;
  local_238 = local_220;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_240,format_str,
             (basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
              )(auVar3 << 0x40));
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2b0,local_238,local_238 + lStack_230);
  local_240 = &PTR_grow_001aeda8;
  if (local_238 != local_220) {
    operator_delete(local_238,local_228);
  }
  emplace_back(this,TypeError,&local_290,&local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290.filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_290.filename._M_dataplus._M_p,
                    local_290.filename.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void typeError(const SourceLocation& sloc, const std::string& f, Args... args) {
    emplace_back(Type::TypeError, sloc, fmt::format(f, std::move(args)...));
  }